

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cc
# Opt level: O0

void __thiscall sptk::Matrix::Matrix(Matrix *this,Matrix *matrix)

{
  size_type __n;
  reference pvVar1;
  reference ppdVar2;
  long in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  vector<double,_std::allocator<double>_> *unaff_retaddr;
  int i;
  allocator_type *__a;
  vector<double_*,_std::allocator<double_*>_> *this_00;
  int local_28;
  
  (in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&PTR__Matrix_00127d28;
  *(undefined4 *)
   &(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_finish = *(undefined4 *)(in_RSI + 8);
  *(undefined4 *)
   ((long)&(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish + 4) = *(undefined4 *)(in_RSI + 0xc);
  std::vector<double,_std::allocator<double>_>::vector(unaff_retaddr,in_RDI);
  __a = (allocator_type *)
        &in_RDI[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
  __n = (size_type)
        *(int *)&(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
  this_00 = (vector<double_*,_std::allocator<double_*>_> *)&stack0xffffffffffffffef;
  std::allocator<double_*>::allocator((allocator<double_*> *)0x119398);
  std::vector<double_*,_std::allocator<double_*>_>::vector(this_00,__n,__a);
  std::allocator<double_*>::~allocator((allocator<double_*> *)0x1193b8);
  for (local_28 = 0;
      local_28 <
      *(int *)&(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_finish; local_28 = local_28 + 1) {
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)
                        &(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_end_of_storage,
                        (long)(local_28 *
                              *(int *)((long)&(in_RDI->
                                              super__Vector_base<double,_std::allocator<double>_>).
                                              _M_impl.super__Vector_impl_data._M_finish + 4)));
    ppdVar2 = std::vector<double_*,_std::allocator<double_*>_>::operator[]
                        ((vector<double_*,_std::allocator<double_*>_> *)
                         &in_RDI[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,(long)local_28);
    *ppdVar2 = pvVar1;
  }
  return;
}

Assistant:

Matrix::Matrix(const Matrix& matrix)
    : num_row_(matrix.num_row_),
      num_column_(matrix.num_column_),
      data_(matrix.data_),
      index_(num_row_) {
  for (int i(0); i < num_row_; ++i) {
    index_[i] = &data_[i * num_column_];
  }
}